

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O3

void __thiscall
picosha2::hash256_one_by_one::process<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (hash256_one_by_one *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last)

{
  long lVar1;
  pointer __src;
  ulong uVar2;
  ulong uVar3;
  pointer puVar4;
  pointer __dest;
  long lVar5;
  
  this->data_length_digits_[0] =
       (word_t)(last._M_current + (this->data_length_digits_[0] - (long)first._M_current));
  lVar1 = 3;
  uVar3 = 0;
  do {
    uVar2 = uVar3 + this->data_length_digits_[lVar1 + -3];
    this->data_length_digits_[lVar1 + -3] = uVar2;
    if (uVar2 < 0x10000) break;
    uVar3 = uVar2 >> 0x10;
    this->data_length_digits_[lVar1 + -3] = uVar2 & 0xffff;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (first._M_current,last._M_current,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)this
            );
  __dest = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (0x3f < (ulong)((long)(this->buffer_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)__dest)) {
    lVar1 = 0;
    do {
      detail::
      hash256_block<unsigned_long*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (this->h_,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )(__dest + lVar1),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(__dest + lVar1 + 0x40));
      __dest = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar4 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar5 = lVar1 + 0x40;
      uVar3 = lVar1 + 0x80;
      lVar1 = lVar5;
    } while (uVar3 <= (ulong)((long)puVar4 - (long)__dest));
    if (lVar5 != 0) {
      __src = __dest + lVar5;
      if (__src != puVar4) {
        memmove(__dest,__src,((long)puVar4 - (long)__dest) - lVar5);
        __src = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
        puVar4 = __src;
      }
      if (__src + -lVar5 != puVar4) {
        (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = __src + -lVar5;
      }
    }
  }
  return;
}

Assistant:

void process(RaIter first, RaIter last) {
        add_to_data_length(static_cast<word_t>(std::distance(first, last)));
        std::copy(first, last, std::back_inserter(buffer_));
        std::size_t i = 0;
        for (; i + 64 <= buffer_.size(); i += 64) {
            detail::hash256_block(h_, buffer_.begin() + i,
                                  buffer_.begin() + i + 64);
        }
        buffer_.erase(buffer_.begin(), buffer_.begin() + i);
    }